

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O2

void __thiscall KDIS::KDataStream::Read<int>(KDataStream *this,int *T)

{
  pointer puVar1;
  ushort uVar2;
  long lVar3;
  uchar uStack_d;
  NetToDataType<int> OctArray;
  
  OctArray.m_Value = *T;
  puVar1 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = this->m_ui16CurrentWritePos;
  for (lVar3 = 1; lVar3 != 5; lVar3 = lVar3 + 1) {
    (&uStack_d)[lVar3] = puVar1[uVar2];
    uVar2 = uVar2 + 1;
    this->m_ui16CurrentWritePos = uVar2;
  }
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<int>::SwapBytes(&OctArray);
  }
  *T = (int)OctArray;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}